

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O0

void Hacl_P256_raw_to_compressed(uint8_t *pk_raw,uint8_t *pk)

{
  uint64_t is_odd_f;
  uint64_t bn_f [4];
  uint8_t *pk_y;
  uint8_t *pk_x;
  uint8_t *pk_local;
  uint8_t *pk_raw_local;
  
  bn_f[3] = (uint64_t)(pk_raw + 0x20);
  memset(&is_odd_f,0,0x20);
  bn_from_bytes_be4(&is_odd_f,(uint8_t *)bn_f[3]);
  *pk = ((byte)is_odd_f & 1) + 2;
  *(undefined8 *)(pk + 1) = *(undefined8 *)pk_raw;
  *(undefined8 *)(pk + 9) = *(undefined8 *)(pk_raw + 8);
  *(undefined8 *)(pk + 0x11) = *(undefined8 *)(pk_raw + 0x10);
  *(undefined8 *)(pk + 0x19) = *(undefined8 *)(pk_raw + 0x18);
  return;
}

Assistant:

void Hacl_P256_raw_to_compressed(uint8_t *pk_raw, uint8_t *pk)
{
  uint8_t *pk_x = pk_raw;
  uint8_t *pk_y = pk_raw + 32U;
  uint64_t bn_f[4U] = { 0U };
  bn_from_bytes_be4(bn_f, pk_y);
  uint64_t is_odd_f = bn_f[0U] & 1ULL;
  pk[0U] = (uint32_t)(uint8_t)is_odd_f + 0x02U;
  memcpy(pk + 1U, pk_x, 32U * sizeof (uint8_t));
}